

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

void BinaryCache::AddImportPath(char *path)

{
  undefined *puVar1;
  undefined8 *puVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  char *importPath;
  char *local_38;
  
  puVar2 = importPaths;
  uVar5 = (ulong)DAT_0024bf74;
  bVar7 = uVar5 != 0;
  if (bVar7) {
    iVar3 = strcmp((char *)*importPaths,path);
    if (iVar3 != 0) {
      uVar6 = 0;
      do {
        if (uVar5 - 1 == uVar6) goto LAB_001379b8;
        iVar3 = strcmp((char *)puVar2[uVar6 + 1],path);
        uVar6 = uVar6 + 1;
      } while (iVar3 != 0);
      bVar7 = uVar6 < uVar5;
    }
    if (bVar7) {
      return;
    }
  }
LAB_001379b8:
  puVar1 = NULLC::alloc;
  sVar4 = strlen(path);
  local_38 = (char *)(*(code *)puVar1)((int)sVar4 + 1);
  strcpy(local_38,path);
  uVar5 = (ulong)DAT_0024bf74;
  if (DAT_0024bf74 == DAT_0024bf70) {
    FastVector<char_*,_false,_false>::grow_and_add
              ((FastVector<char_*,_false,_false> *)&importPaths,DAT_0024bf74,&local_38);
  }
  else {
    DAT_0024bf74 = DAT_0024bf74 + 1;
    importPaths[uVar5] = local_38;
  }
  return;
}

Assistant:

void BinaryCache::AddImportPath(const char* path)
{
	for(unsigned int i = 0; i < importPaths.size(); i++)
	{
		if(strcmp(importPaths[i], path) == 0)
			return;
	}

	char *importPath = (char*)NULLC::alloc(int(strlen(path)) + 1);
	strcpy(importPath, path);
	importPaths.push_back(importPath);
}